

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O3

qsizetype __thiscall QTextBoundaryFinder::toNextBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pQVar1 = this->attributes;
  if (((pQVar1 != (QCharAttributes *)0x0) && (lVar2 = this->pos, -1 < lVar2)) &&
     (uVar3 = (this->sv).m_size, lVar2 < (long)uVar3)) {
    uVar4 = lVar2 + 1;
    this->pos = uVar4;
    uVar5 = uVar4;
    switch(this->t) {
    case Grapheme:
      if (uVar4 < uVar3) {
        do {
          if (((byte)pQVar1[uVar4] & 1) != 0) {
            return uVar4;
          }
          uVar4 = uVar4 + 1;
          this->pos = uVar4;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
      }
      break;
    case Word:
      if (uVar4 < uVar3) {
        do {
          if (((byte)pQVar1[uVar4] & 2) != 0) {
            return uVar4;
          }
          uVar4 = uVar4 + 1;
          this->pos = uVar4;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
      }
      break;
    case Sentence:
      if (uVar4 < uVar3) {
        do {
          if (((byte)pQVar1[uVar4] & 4) != 0) {
            return uVar4;
          }
          uVar4 = uVar4 + 1;
          this->pos = uVar4;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
      }
      break;
    case Line:
      if (uVar4 < uVar3) {
        do {
          if (((byte)pQVar1[uVar4] & 8) != 0) {
            return uVar4;
          }
          uVar4 = uVar4 + 1;
          this->pos = uVar4;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
      }
    }
    return uVar5;
  }
  this->pos = -1;
  return -1;
}

Assistant:

qsizetype QTextBoundaryFinder::toNextBoundary()
{
    if (!attributes || pos < 0 || pos >= sv.size()) {
        pos = -1;
        return pos;
    }

    ++pos;
    switch(t) {
    case Grapheme:
        while (pos < sv.size() && !attributes[pos].graphemeBoundary)
            ++pos;
        break;
    case Word:
        while (pos < sv.size() && !attributes[pos].wordBreak)
            ++pos;
        break;
    case Sentence:
        while (pos < sv.size() && !attributes[pos].sentenceBoundary)
            ++pos;
        break;
    case Line:
        while (pos < sv.size() && !attributes[pos].lineBreak)
            ++pos;
        break;
    }

    return pos;
}